

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itm-solver-inequalities-101.cpp
# Opt level: O0

rc_size __thiscall
baryonyx::itm::
solver_inequalities_101coeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<long_double>,_false>
::compute_reduced_costs<baryonyx::bit_array>
          (solver_inequalities_101coeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<long_double>,_false>
           *this,row_iterator begin,row_iterator end,bit_array *x)

{
  tuple<baryonyx::sparse_matrix<int>::col_value_*,_baryonyx::sparse_matrix<int>::col_value_*> *__t;
  __tuple_element_t<0UL,_tuple<col_value_*,_col_value_*>_> pcVar1;
  rc_size rVar2;
  bool bVar3;
  int iVar4;
  __tuple_element_t<0UL,_tuple<col_value_*,_col_value_*>_> *ppcVar5;
  __tuple_element_t<1UL,_tuple<col_value_*,_col_value_*>_> *ppcVar6;
  type plVar7;
  type prVar8;
  longdouble in_ST0;
  longdouble in_ST1;
  longdouble lVar9;
  longdouble in_ST2;
  longdouble in_ST3;
  longdouble in_ST4;
  longdouble in_ST5;
  longdouble lVar10;
  longdouble a;
  tuple<baryonyx::sparse_matrix<int>::col_value_*,_baryonyx::sparse_matrix<int>::col_value_*> ht;
  longdouble sum_a_p;
  longdouble sum_a_pi;
  int local_34;
  int c_size;
  int r_size;
  bit_array *x_local;
  row_iterator end_local;
  row_iterator begin_local;
  solver_inequalities_101coeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<long_double>,_false>
  *this_local;
  
  local_34 = 0;
  stack0xffffffffffffffc8 = 0;
  for (end_local = begin; end_local != end; end_local = end_local + 1) {
    unique0x00076c00 = (longdouble)0;
    lVar10 = in_ST5;
    unique0x100002e0 = unique0x00076c00;
    sparse_matrix<int>::column((sparse_matrix<int> *)((long)&a + 8),(int)this + 0x10);
    lVar9 = in_ST0;
    in_ST0 = in_ST1;
    in_ST1 = in_ST2;
    in_ST2 = in_ST3;
    in_ST3 = in_ST4;
    in_ST4 = in_ST5;
    in_ST5 = lVar10;
    while( true ) {
      ppcVar5 = std::
                get<0ul,baryonyx::sparse_matrix<int>::col_value*,baryonyx::sparse_matrix<int>::col_value*>
                          ((tuple<baryonyx::sparse_matrix<int>::col_value_*,_baryonyx::sparse_matrix<int>::col_value_*>
                            *)((long)&a + 8));
      pcVar1 = *ppcVar5;
      ppcVar6 = std::
                get<1ul,baryonyx::sparse_matrix<int>::col_value*,baryonyx::sparse_matrix<int>::col_value*>
                          ((tuple<baryonyx::sparse_matrix<int>::col_value_*,_baryonyx::sparse_matrix<int>::col_value_*>
                            *)((long)&a + 8));
      if (pcVar1 == *ppcVar6) break;
      __t = (tuple<baryonyx::sparse_matrix<int>::col_value_*,_baryonyx::sparse_matrix<int>::col_value_*>
             *)((long)&a + 8);
      ppcVar5 = std::
                get<0ul,baryonyx::sparse_matrix<int>::col_value*,baryonyx::sparse_matrix<int>::col_value*>
                          (__t);
      iVar4 = value_bit_array<-1,_1>::get(&this->A,(*ppcVar5)->value);
      ppcVar5 = std::
                get<0ul,baryonyx::sparse_matrix<int>::col_value*,baryonyx::sparse_matrix<int>::col_value*>
                          (__t);
      plVar7 = std::unique_ptr<long_double[],_std::default_delete<long_double[]>_>::operator[]
                         (&this->pi,(long)(*ppcVar5)->row);
      register0x00001110 = (longdouble)iVar4 * *plVar7 + stack0xffffffffffffffb8;
      ppcVar5 = std::
                get<0ul,baryonyx::sparse_matrix<int>::col_value*,baryonyx::sparse_matrix<int>::col_value*>
                          (__t);
      plVar7 = std::unique_ptr<long_double[],_std::default_delete<long_double[]>_>::operator[]
                         (&this->P,(long)(*ppcVar5)->value);
      register0x00001110 = (longdouble)iVar4 * *plVar7 + stack0xffffffffffffffa8;
      in_ST4 = in_ST3;
      in_ST5 = in_ST3;
      ppcVar5 = std::
                get<0ul,baryonyx::sparse_matrix<int>::col_value*,baryonyx::sparse_matrix<int>::col_value*>
                          ((tuple<baryonyx::sparse_matrix<int>::col_value_*,_baryonyx::sparse_matrix<int>::col_value_*>
                            *)((long)&a + 8));
      *ppcVar5 = *ppcVar5 + 1;
    }
    prVar8 = std::
             unique_ptr<baryonyx::itm::solver_inequalities_101coeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<long_double>,_false>::rc_data[],_std::default_delete<baryonyx::itm::solver_inequalities_101coeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<long_double>,_false>::rc_data[]>_>
             ::operator[](&this->R,(long)local_34);
    prVar8->id = local_34;
    default_cost_type<long_double>::operator()
              ((longdouble *)this->c,
               (default_cost_type<long_double> *)(ulong)(uint)end_local->column,(int)x,
               (bit_array *)prVar8);
    lVar9 = (lVar9 - stack0xffffffffffffffb8) - stack0xffffffffffffffa8;
    prVar8 = std::
             unique_ptr<baryonyx::itm::solver_inequalities_101coeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<long_double>,_false>::rc_data[],_std::default_delete<baryonyx::itm::solver_inequalities_101coeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<long_double>,_false>::rc_data[]>_>
             ::operator[](&this->R,(long)local_34);
    prVar8->value = lVar9;
    iVar4 = value_bit_array<-1,_1>::get(&this->A,end_local->value);
    prVar8 = std::
             unique_ptr<baryonyx::itm::solver_inequalities_101coeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<long_double>,_false>::rc_data[],_std::default_delete<baryonyx::itm::solver_inequalities_101coeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<long_double>,_false>::rc_data[]>_>
             ::operator[](&this->R,(long)local_34);
    prVar8->f = iVar4;
    prVar8 = std::
             unique_ptr<baryonyx::itm::solver_inequalities_101coeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<long_double>,_false>::rc_data[],_std::default_delete<baryonyx::itm::solver_inequalities_101coeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<long_double>,_false>::rc_data[]>_>
             ::operator[](&this->R,(long)local_34);
    bVar3 = rc_data::is_negative_factor(prVar8);
    if (bVar3) {
      prVar8 = std::
               unique_ptr<baryonyx::itm::solver_inequalities_101coeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<long_double>,_false>::rc_data[],_std::default_delete<baryonyx::itm::solver_inequalities_101coeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<long_double>,_false>::rc_data[]>_>
               ::operator[](&this->R,(long)local_34);
      lVar9 = prVar8->value;
      prVar8 = std::
               unique_ptr<baryonyx::itm::solver_inequalities_101coeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<long_double>,_false>::rc_data[],_std::default_delete<baryonyx::itm::solver_inequalities_101coeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<long_double>,_false>::rc_data[]>_>
               ::operator[](&this->R,(long)local_34);
      prVar8->value = -lVar9;
      register0x00000000 = stack0xffffffffffffffc8 + 1;
    }
    local_34 = local_34 + 1;
  }
  rVar2.c_size = stack0xffffffffffffffc8;
  rVar2.r_size = local_34;
  return rVar2;
}

Assistant:

rc_size compute_reduced_costs(sparse_matrix<int>::row_iterator begin,
                                  sparse_matrix<int>::row_iterator end,
                                  const Xtype& x) noexcept
    {
        int r_size = 0;
        int c_size = 0;

        for (; begin != end; ++begin) {
            Float sum_a_pi = 0;
            Float sum_a_p = 0;

            auto ht = ap.column(begin->column);

            for (; std::get<0>(ht) != std::get<1>(ht); ++std::get<0>(ht)) {
                auto a = static_cast<Float>(A.get(std::get<0>(ht)->value));

                sum_a_pi += a * pi[std::get<0>(ht)->row];
                sum_a_p += a * P[std::get<0>(ht)->value];
            }

            R[r_size].id = r_size;
            R[r_size].value = c(begin->column, x) - sum_a_pi - sum_a_p;
            R[r_size].f = A.get(begin->value);

            if (R[r_size].is_negative_factor()) {
                R[r_size].value = -R[r_size].value;
                ++c_size;
            }

            ++r_size;
        }

        return { r_size, c_size };
    }